

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_Basics_Test::TestBody(TypeTest_Basics_Test *this)

{
  allocator<wasm::Type> *this_00;
  allocator<wasm::Field> *this_01;
  initializer_list<wasm::Field> __l;
  Signature signature;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Type> __l_01;
  bool bVar1;
  char *pcVar2;
  HeapType HVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  Type type;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar6;
  Struct *lhs;
  char *in_R9;
  Entry EVar7;
  AssertHelper local_500;
  Message local_4f8;
  uintptr_t local_4f0;
  Field local_4e8;
  Array local_4d8;
  Array local_4c8;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_4;
  Message local_4a0;
  allocator<wasm::Field> local_491;
  uintptr_t local_490;
  Field local_488;
  iterator local_478;
  size_type local_470;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_468;
  Struct local_450;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_3;
  Message local_420;
  uintptr_t local_418;
  Type local_410;
  uintptr_t *local_408;
  undefined8 local_400;
  Type local_3f8;
  Type local_3f0;
  Signature local_3e8;
  Signature local_3d8;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_2;
  Type local_3b0;
  Type newRefNullArray;
  Type local_3a0;
  Type newRefArray;
  Type local_390;
  Type newRefStruct;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__1;
  Message local_2a8;
  unsigned_long local_2a0;
  size_type local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Array local_1f8;
  Entry local_1e8;
  Entry local_1d8;
  Type local_1c8;
  Type TStack_1c0;
  uintptr_t local_1b8;
  Field local_1b0;
  undefined1 local_1a0 [8];
  Array array;
  Field local_180;
  iterator local_170;
  size_type local_168;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_160;
  undefined1 local_148 [8];
  Struct struct_;
  Type local_128;
  Type local_120;
  iterator local_118;
  size_type local_110;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_108;
  uintptr_t local_f0;
  Type local_e8;
  undefined1 auStack_e0 [8];
  Signature sig;
  Type local_c8;
  Type refNullAny;
  Type refNullArray;
  Type refArray;
  Type refStruct;
  AssertHelper local_58;
  Message local_50;
  unsigned_long local_48 [3];
  unsigned_long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  TypeBuilder builder;
  TypeTest_Basics_Test *this_local;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&gtest_ar.message_,3);
  local_30 = ::wasm::TypeBuilder::size();
  local_48[0] = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_28,"builder.size()","size_t{3}",&local_30,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,1);
    refArray.id = (uintptr_t)EVar7.builder;
    HVar3 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refArray);
    uVar4 = ::wasm::TypeBuilder::getTempRefType
                      ((HeapType)&gtest_ar.message_,(Nullability)HVar3.id,Inexact);
    EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    refNullArray.id = (uintptr_t)EVar7.builder;
    HVar3 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refNullArray);
    uVar5 = ::wasm::TypeBuilder::getTempRefType
                      ((HeapType)&gtest_ar.message_,(Nullability)HVar3.id,Inexact);
    EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    refNullAny.id = (uintptr_t)EVar7.builder;
    HVar3 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refNullAny);
    type.id = ::wasm::TypeBuilder::getTempRefType
                        ((HeapType)&gtest_ar.message_,(Nullability)HVar3.id,Exact);
    ::wasm::HeapType::HeapType((HeapType *)&sig.results,any);
    ::wasm::Type::Type(&local_c8,(HeapType)sig.results.id,Nullable,Inexact);
    local_128.id = uVar5;
    local_e8.id = uVar4;
    ::wasm::Type::Type(&local_120,i32);
    local_118 = &local_128;
    local_110 = 2;
    this_00 = (allocator<wasm::Type> *)
              ((long)&struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<wasm::Type>::allocator(this_00);
    __l_01._M_len = local_110;
    __l_01._M_array = local_118;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_108,__l_01,this_00);
    local_f0 = ::wasm::TypeBuilder::getTempTupleType((vector *)&gtest_ar.message_);
    ::wasm::Signature::Signature((Signature *)auStack_e0,local_e8,(Type)local_f0);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_108);
    std::allocator<wasm::Type>::~allocator
              ((allocator<wasm::Type> *)
               ((long)&struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ::wasm::Field::Field(&local_180,type,Immutable);
    local_170 = &local_180;
    local_168 = 1;
    this_01 = (allocator<wasm::Field> *)((long)&array.element.mutable_ + 3);
    std::allocator<wasm::Field>::allocator(this_01);
    __l_00._M_len = local_168;
    __l_00._M_array = local_170;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_160,__l_00,this_01);
    ::wasm::Struct::Struct((Struct *)local_148,&local_160);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_160);
    std::allocator<wasm::Field>::~allocator
              ((allocator<wasm::Field> *)((long)&array.element.mutable_ + 3));
    local_1b8 = local_c8.id;
    ::wasm::Field::Field(&local_1b0,local_c8,Mutable);
    ::wasm::Array::Array((Array *)local_1a0,local_1b0);
    local_1c8.id = (uintptr_t)auStack_e0;
    TStack_1c0.id = sig.params.id;
    local_1d8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,0);
    signature.results.id = TStack_1c0.id;
    signature.params.id = local_1c8.id;
    ::wasm::TypeBuilder::Entry::operator=(&local_1d8,signature);
    local_1e8 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,1);
    ::wasm::TypeBuilder::Entry::operator=(&local_1e8,(Struct *)local_148);
    ::wasm::Array::Array(&local_1f8,(Array *)local_1a0);
    EVar7 = ::wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    result.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         EVar7.builder;
    ::wasm::TypeBuilder::Entry::operator=
              ((Entry *)((long)&result.
                                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        + 0x18),&local_1f8);
    ::wasm::TypeBuilder::createRecGroup((ulong)&gtest_ar.message_,0);
    ::wasm::TypeBuilder::build();
    testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
              ((AssertionResult *)local_238,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)local_238,
                 (AssertionResult *)0x4945b1,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xbb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      std::__cxx11::string::~string
                ((string *)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    if (bVar1) {
      __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_,__x
                );
      local_298 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                             &gtest_ar_1.message_);
      local_2a0 = 3;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_290,"built.size()","size_t{3}",&local_298,&local_2a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0xbd,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_2a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
      if (bVar1) {
        pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar_1.message_,0);
        local_2c1 = ::wasm::HeapType::isSignature(pvVar6);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
        if (!bVar1) {
          testing::Message::Message(&local_2d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_2c0,
                     (AssertionResult *)"built[0].isSignature()","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xc0,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
          testing::internal::AssertHelper::~AssertHelper(&local_2d8);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_2d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        if (bVar1) {
          pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &gtest_ar_1.message_,1);
          local_309 = ::wasm::HeapType::isStruct(pvVar6);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_308,&local_309,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
          if (!bVar1) {
            testing::Message::Message(&local_318);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__3.message_,(internal *)local_308,
                       (AssertionResult *)"built[1].isStruct()","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_320,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0xc1,pcVar2);
            testing::internal::AssertHelper::operator=(&local_320,&local_318);
            testing::internal::AssertHelper::~AssertHelper(&local_320);
            std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_318);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
          if (bVar1) {
            pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                               ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                &gtest_ar_1.message_,2);
            local_351 = ::wasm::HeapType::isArray(pvVar6);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_350,&local_351,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
            if (!bVar1) {
              testing::Message::Message(&local_360);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&newRefStruct,(internal *)local_350,
                         (AssertionResult *)"built[2].isArray()","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_368,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xc2,pcVar2);
              testing::internal::AssertHelper::operator=(&local_368,&local_360);
              testing::internal::AssertHelper::~AssertHelper(&local_368);
              std::__cxx11::string::~string((string *)&newRefStruct);
              testing::Message::~Message(&local_360);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
            if (bVar1) {
              pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,1);
              newRefArray.id = pvVar6->id;
              ::wasm::Type::Type(&local_390,(HeapType)newRefArray.id,NonNullable,Inexact);
              pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,2);
              newRefNullArray.id = pvVar6->id;
              ::wasm::Type::Type(&local_3a0,(HeapType)newRefNullArray.id,NonNullable,Inexact);
              pvVar6 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,2);
              gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )pvVar6->id;
              ::wasm::Type::Type(&local_3b0,
                                 (HeapType)
                                 gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,Nullable,Inexact);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,0);
              local_3d8 = (Signature)::wasm::HeapType::getSignature();
              local_3f0.id = local_390.id;
              local_418 = local_3a0.id;
              ::wasm::Type::Type(&local_410,i32);
              local_408 = &local_418;
              local_400 = 2;
              ::wasm::Type::Type(&local_3f8,local_408,2);
              ::wasm::Signature::Signature(&local_3e8,local_3f0,local_3f8);
              testing::internal::EqHelper::Compare<wasm::Signature,_wasm::Signature,_nullptr>
                        ((EqHelper *)local_3c8,"built[0].getSignature()",
                         "Signature(newRefStruct, {newRefArray, Type::i32})",&local_3d8,&local_3e8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
              if (!bVar1) {
                testing::Message::Message(&local_420);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xca,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_3.message_,&local_420);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_)
                ;
                testing::Message::~Message(&local_420);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,1);
              lhs = (Struct *)::wasm::HeapType::getStruct();
              local_490 = local_3b0.id;
              ::wasm::Field::Field(&local_488,local_3b0,Immutable);
              local_478 = &local_488;
              local_470 = 1;
              std::allocator<wasm::Field>::allocator(&local_491);
              __l._M_len = local_470;
              __l._M_array = local_478;
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                        (&local_468,__l,&local_491);
              ::wasm::Struct::Struct(&local_450,&local_468);
              testing::internal::EqHelper::Compare<wasm::Struct,_wasm::Struct,_nullptr>
                        ((EqHelper *)local_438,"built[1].getStruct()",
                         "Struct({Field(newRefNullArray, Immutable)})",lhs,&local_450);
              ::wasm::Struct::~Struct(&local_450);
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_468);
              std::allocator<wasm::Field>::~allocator(&local_491);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
              if (!bVar1) {
                testing::Message::Message(&local_4a0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xcb,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_4.message_,&local_4a0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_)
                ;
                testing::Message::~Message(&local_4a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,2);
              ::wasm::HeapType::getArray();
              local_4f0 = local_c8.id;
              ::wasm::Field::Field(&local_4e8,local_c8,Mutable);
              ::wasm::Array::Array(&local_4d8,local_4e8);
              testing::internal::EqHelper::Compare<wasm::Array,_wasm::Array,_nullptr>
                        ((EqHelper *)local_4b8,"built[2].getArray()",
                         "Array(Field(refNullAny, Mutable))",&local_4c8,&local_4d8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
              if (!bVar1) {
                testing::Message::Message(&local_4f8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_500,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xcc,pcVar2);
                testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                testing::internal::AssertHelper::~AssertHelper(&local_500);
                testing::Message::~Message(&local_4f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
            }
          }
        }
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_);
    }
    ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
    ::wasm::Struct::~Struct((Struct *)local_148);
  }
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TypeTest, Basics) {
  // (type $sig (func (param (ref $struct)) (result (ref $array) i32)))
  // (type $struct (struct (field (ref null $array))))
  // (type $array (array (mut anyref)))
  TypeBuilder builder(3);
  ASSERT_EQ(builder.size(), size_t{3});

  Type refStruct = builder.getTempRefType(builder[1], NonNullable);
  Type refArray = builder.getTempRefType(builder[2], NonNullable);
  Type refNullArray = builder.getTempRefType(builder[2], Nullable);
  Type refNullAny(HeapType::any, Nullable);

  Signature sig(refStruct, builder.getTempTupleType({refArray, Type::i32}));
  Struct struct_({Field(refNullArray, Immutable)});
  Array array(Field(refNullAny, Mutable));

  builder[0] = sig;
  builder[1] = struct_;
  builder[2] = array;

  builder.createRecGroup(0, 3);

  auto result = builder.build();
  ASSERT_TRUE(result);
  std::vector<HeapType> built = *result;
  ASSERT_EQ(built.size(), size_t{3});

  // The built types should have the correct kinds.
  ASSERT_TRUE(built[0].isSignature());
  ASSERT_TRUE(built[1].isStruct());
  ASSERT_TRUE(built[2].isArray());

  // The built types should have the correct structure.
  Type newRefStruct = Type(built[1], NonNullable);
  Type newRefArray = Type(built[2], NonNullable);
  Type newRefNullArray = Type(built[2], Nullable);

  EXPECT_EQ(built[0].getSignature(),
            Signature(newRefStruct, {newRefArray, Type::i32}));
  EXPECT_EQ(built[1].getStruct(), Struct({Field(newRefNullArray, Immutable)}));
  EXPECT_EQ(built[2].getArray(), Array(Field(refNullAny, Mutable)));
}